

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imstb_truetype.h
# Opt level: O0

int stbtt_PackFontRangesRenderIntoRects
              (stbtt_pack_context *spc,stbtt_fontinfo *info,stbtt_pack_range *ranges,int num_ranges,
              stbrp_rect *rects)

{
  short sVar1;
  undefined2 uVar2;
  int glyph_index;
  int local_9c;
  float local_98;
  stbrp_coord pad;
  int glyph;
  int codepoint;
  int y1;
  int x1;
  int y0;
  int x0;
  int lsb;
  int advance;
  stbtt_packedchar *bc;
  stbrp_rect *r;
  float sub_y;
  float sub_x;
  float recip_v;
  float recip_h;
  float scale;
  float fh;
  int old_v_over;
  int old_h_over;
  int return_value;
  int k;
  int j;
  int i;
  stbrp_rect *rects_local;
  stbtt_pack_range *psStack_20;
  int num_ranges_local;
  stbtt_pack_range *ranges_local;
  stbtt_fontinfo *info_local;
  stbtt_pack_context *spc_local;
  
  old_v_over = 1;
  fh = (float)spc->h_oversample;
  scale = (float)spc->v_oversample;
  old_h_over = 0;
  _j = rects;
  rects_local._4_4_ = num_ranges;
  psStack_20 = ranges;
  ranges_local = (stbtt_pack_range *)info;
  info_local = (stbtt_fontinfo *)spc;
  for (k = 0; k < rects_local._4_4_; k = k + 1) {
    recip_h = psStack_20[k].font_size;
    if (recip_h <= 0.0) {
      local_98 = stbtt_ScaleForMappingEmToPixels((stbtt_fontinfo *)ranges_local,-recip_h);
    }
    else {
      local_98 = stbtt_ScaleForPixelHeight((stbtt_fontinfo *)ranges_local,recip_h);
    }
    recip_v = local_98;
    info_local->hhea = (uint)psStack_20[k].h_oversample;
    info_local->hmtx = (uint)psStack_20[k].v_oversample;
    sub_x = 1.0 / (float)(uint)info_local->hhea;
    sub_y = 1.0 / (float)(uint)info_local->hmtx;
    r._4_4_ = stbtt__oversample_shift(info_local->hhea);
    r._0_4_ = stbtt__oversample_shift(info_local->hmtx);
    for (return_value = 0; return_value < psStack_20[k].num_chars; return_value = return_value + 1)
    {
      bc = (stbtt_packedchar *)(_j + old_h_over);
      if (((bc->yoff == 0.0) || (bc->x1 == 0)) || (bc->y1 == 0)) {
        old_v_over = 0;
      }
      else {
        _lsb = psStack_20[k].chardata_for_range + return_value;
        if (psStack_20[k].array_of_unicode_codepoints == (int *)0x0) {
          local_9c = psStack_20[k].first_unicode_codepoint_in_range + return_value;
        }
        else {
          local_9c = psStack_20[k].array_of_unicode_codepoints[return_value];
        }
        glyph_index = stbtt_FindGlyphIndex((stbtt_fontinfo *)ranges_local,local_9c);
        sVar1 = (short)info_local->head;
        *(short *)&bc->xoff = SUB42(bc->xoff,0) + sVar1;
        *(short *)((long)&bc->xoff + 2) = *(short *)((long)&bc->xoff + 2) + sVar1;
        uVar2 = bc->x1;
        bc->x1 = uVar2 - sVar1;
        bc->y1 = bc->y1 - sVar1;
        stbtt_GetGlyphHMetrics((stbtt_fontinfo *)ranges_local,glyph_index,&x0,&y0);
        stbtt_GetGlyphBitmapBox
                  ((stbtt_fontinfo *)ranges_local,glyph_index,
                   recip_v * (float)(uint)info_local->hhea,recip_v * (float)(uint)info_local->hmtx,
                   &x1,&y1,&codepoint,&glyph);
        stbtt_MakeGlyphBitmapSubpixel
                  ((stbtt_fontinfo *)ranges_local,
                   (uchar *)(*(long *)&info_local->gpos + (ulong)*(ushort *)&bc->xoff +
                            (long)(int)((uint)*(ushort *)((long)&bc->xoff + 2) * info_local->loca)),
                   ((uint)bc->x1 - info_local->hhea) + 1,((uint)bc->y1 - info_local->hmtx) + 1,
                   info_local->loca,recip_v * (float)(uint)info_local->hhea,
                   recip_v * (float)(uint)info_local->hmtx,0.0,0.0,glyph_index);
        if (1 < (uint)info_local->hhea) {
          stbtt__h_prefilter((uchar *)(*(long *)&info_local->gpos +
                                       (long)(int)(uint)*(ushort *)&bc->xoff +
                                      (long)(int)((uint)*(ushort *)((long)&bc->xoff + 2) *
                                                 info_local->loca)),(uint)bc->x1,(uint)bc->y1,
                             info_local->loca,info_local->hhea);
        }
        if (1 < (uint)info_local->hmtx) {
          stbtt__v_prefilter((uchar *)(*(long *)&info_local->gpos +
                                       (long)(int)(uint)*(ushort *)&bc->xoff +
                                      (long)(int)((uint)*(ushort *)((long)&bc->xoff + 2) *
                                                 info_local->loca)),(uint)bc->x1,(uint)bc->y1,
                             info_local->loca,info_local->hmtx);
        }
        _lsb->x0 = *(unsigned_short *)&bc->xoff;
        _lsb->y0 = *(unsigned_short *)((long)&bc->xoff + 2);
        _lsb->x1 = *(short *)&bc->xoff + bc->x1;
        _lsb->y1 = *(short *)((long)&bc->xoff + 2) + bc->y1;
        _lsb->xadvance = recip_v * (float)x0;
        _lsb->xoff = (float)x1 * sub_x + r._4_4_;
        _lsb->yoff = (float)y1 * sub_y + r._0_4_;
        _lsb->xoff2 = (float)(int)(x1 + (uint)bc->x1) * sub_x + r._4_4_;
        _lsb->yoff2 = (float)(int)(y1 + (uint)bc->y1) * sub_y + r._0_4_;
      }
      old_h_over = old_h_over + 1;
    }
  }
  info_local->hhea = (int)fh;
  info_local->hmtx = (int)scale;
  return old_v_over;
}

Assistant:

STBTT_DEF int stbtt_PackFontRangesRenderIntoRects(stbtt_pack_context *spc, const stbtt_fontinfo *info, stbtt_pack_range *ranges, int num_ranges, stbrp_rect *rects)
{
   int i,j,k, return_value = 1;

   // save current values
   int old_h_over = spc->h_oversample;
   int old_v_over = spc->v_oversample;

   k = 0;
   for (i=0; i < num_ranges; ++i) {
      float fh = ranges[i].font_size;
      float scale = fh > 0 ? stbtt_ScaleForPixelHeight(info, fh) : stbtt_ScaleForMappingEmToPixels(info, -fh);
      float recip_h,recip_v,sub_x,sub_y;
      spc->h_oversample = ranges[i].h_oversample;
      spc->v_oversample = ranges[i].v_oversample;
      recip_h = 1.0f / spc->h_oversample;
      recip_v = 1.0f / spc->v_oversample;
      sub_x = stbtt__oversample_shift(spc->h_oversample);
      sub_y = stbtt__oversample_shift(spc->v_oversample);
      for (j=0; j < ranges[i].num_chars; ++j) {
         stbrp_rect *r = &rects[k];
         if (r->was_packed && r->w != 0 && r->h != 0) {
            stbtt_packedchar *bc = &ranges[i].chardata_for_range[j];
            int advance, lsb, x0,y0,x1,y1;
            int codepoint = ranges[i].array_of_unicode_codepoints == NULL ? ranges[i].first_unicode_codepoint_in_range + j : ranges[i].array_of_unicode_codepoints[j];
            int glyph = stbtt_FindGlyphIndex(info, codepoint);
            stbrp_coord pad = (stbrp_coord) spc->padding;

            // pad on left and top
            r->x += pad;
            r->y += pad;
            r->w -= pad;
            r->h -= pad;
            stbtt_GetGlyphHMetrics(info, glyph, &advance, &lsb);
            stbtt_GetGlyphBitmapBox(info, glyph,
                                    scale * spc->h_oversample,
                                    scale * spc->v_oversample,
                                    &x0,&y0,&x1,&y1);
            stbtt_MakeGlyphBitmapSubpixel(info,
                                          spc->pixels + r->x + r->y*spc->stride_in_bytes,
                                          r->w - spc->h_oversample+1,
                                          r->h - spc->v_oversample+1,
                                          spc->stride_in_bytes,
                                          scale * spc->h_oversample,
                                          scale * spc->v_oversample,
                                          0,0,
                                          glyph);

            if (spc->h_oversample > 1)
               stbtt__h_prefilter(spc->pixels + r->x + r->y*spc->stride_in_bytes,
                                  r->w, r->h, spc->stride_in_bytes,
                                  spc->h_oversample);

            if (spc->v_oversample > 1)
               stbtt__v_prefilter(spc->pixels + r->x + r->y*spc->stride_in_bytes,
                                  r->w, r->h, spc->stride_in_bytes,
                                  spc->v_oversample);

            bc->x0       = (stbtt_int16)  r->x;
            bc->y0       = (stbtt_int16)  r->y;
            bc->x1       = (stbtt_int16) (r->x + r->w);
            bc->y1       = (stbtt_int16) (r->y + r->h);
            bc->xadvance =                scale * advance;
            bc->xoff     =       (float)  x0 * recip_h + sub_x;
            bc->yoff     =       (float)  y0 * recip_v + sub_y;
            bc->xoff2    =                (x0 + r->w) * recip_h + sub_x;
            bc->yoff2    =                (y0 + r->h) * recip_v + sub_y;
         } else {
            return_value = 0; // if any fail, report failure
         }

         ++k;
      }
   }

   // restore original values
   spc->h_oversample = old_h_over;
   spc->v_oversample = old_v_over;

   return return_value;
}